

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::RollupOutput::PrettyPrintRow
          (RollupOutput *this,RollupRow *row,size_t indent,OutputOptions *options,ostream *out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  undefined1 force_sign;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 extraout_DL_03;
  undefined1 extraout_DL_04;
  undefined1 diff_mode;
  string local_70;
  string local_50;
  
  force_sign = SUB81(options,0);
  if (&this->toplevel_row_ != row) {
    if ((options->show == kShowVM) && ((row->size).vm == 0)) {
      return;
    }
    if ((options->show == kShowFile) && ((row->size).file == 0)) {
      return;
    }
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,anon_var_dwarf_3f6ae0 + 0x11);
  anon_unknown_35::FixedWidthString(&local_50,&local_70,indent);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  paVar1 = &local_50.field_2;
  diff_mode = extraout_DL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    diff_mode = extraout_DL_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    diff_mode = extraout_DL_01;
  }
  if (options->show != kShowVM) {
    (anonymous_namespace)::PercentString_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)(ulong)this->diff_mode_,row->filepercent,
               (bool)diff_mode);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    (anonymous_namespace)::SiPrint_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)(row->size).file,(ulong)this->diff_mode_,
               (bool)force_sign);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
    diff_mode = extraout_DL_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      diff_mode = extraout_DL_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      diff_mode = extraout_DL_04;
    }
    if (options->show == kShowFile) goto LAB_00186251;
  }
  (anonymous_namespace)::PercentString_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)(ulong)this->diff_mode_,row->vmpercent,
             (bool)diff_mode);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  (anonymous_namespace)::SiPrint_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)(row->size).vm,(ulong)this->diff_mode_,
             (bool)force_sign);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_00186251:
  std::__ostream_insert<char,std::char_traits<char>>(out,"   ",3);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(row->name)._M_dataplus._M_p,(row->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  return;
}

Assistant:

void RollupOutput::PrettyPrintRow(const RollupRow& row, size_t indent,
                                  const OutputOptions& options,
                                  std::ostream* out) const {
  if (&row != &toplevel_row_) {
    // Avoid printing this row if it is only zero.
    // This can happen when using --domain if the row is zero for this domain.
    if ((!ShowFile(options) && row.size.vm == 0) ||
        (!ShowVM(options) && row.size.file == 0)) {
      return;
    }
  }

  *out << FixedWidthString("", indent) << " ";

  if (ShowFile(options)) {
    *out << PercentString(row.filepercent, diff_mode_) << " "
         << SiPrint(row.size.file, diff_mode_) << " ";
  }

  if (ShowVM(options)) {
    *out << PercentString(row.vmpercent, diff_mode_) << " "
         << SiPrint(row.size.vm, diff_mode_) << " ";
  }

  *out << "   " << row.name << "\n";
}